

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Cat(Compiler *this,Frag a,Frag b)

{
  Inst *pIVar1;
  bool bVar2;
  InstOp IVar3;
  int iVar4;
  Frag FVar5;
  Inst *begin;
  Compiler *this_local;
  Frag b_local;
  Frag a_local;
  
  bVar2 = IsNoMatch(a);
  if ((bVar2) || (bVar2 = IsNoMatch(b), bVar2)) {
    FVar5 = NoMatch(this);
    return FVar5;
  }
  pIVar1 = this->inst_;
  IVar3 = Prog::Inst::opcode(pIVar1 + ((ulong)a & 0xffffffff));
  b_local.begin = a.begin;
  this_local._0_4_ = b.begin;
  b_local.end = a.end.p;
  if ((IVar3 == kInstNop) &&
     ((b_local.end.p == b_local.begin * 2 &&
      (iVar4 = Prog::Inst::out(pIVar1 + ((ulong)a & 0xffffffff)), iVar4 == 0)))) {
    PatchList::Patch(this->inst_,b_local.end,(uint32)this_local);
    return b;
  }
  this_local._4_4_ = b.end.p;
  if ((this->reversed_ & 1U) != 0) {
    PatchList::Patch(this->inst_,this_local._4_4_,b_local.begin);
    Frag::Frag(&a_local,(uint32)this_local,b_local.end);
    return a_local;
  }
  PatchList::Patch(this->inst_,b_local.end,(uint32)this_local);
  Frag::Frag(&a_local,b_local.begin,this_local._4_4_);
  return a_local;
}

Assistant:

Frag Compiler::Cat(Frag a, Frag b) {
  if (IsNoMatch(a) || IsNoMatch(b))
    return NoMatch();

  // Elide no-op.
  Prog::Inst* begin = &inst_[a.begin];
  if (begin->opcode() == kInstNop &&
      a.end.p == (a.begin << 1) &&
      begin->out() == 0) {
    PatchList::Patch(inst_, a.end, b.begin);  // in case refs to a somewhere
    return b;
  }

  // To run backward over string, reverse all concatenations.
  if (reversed_) {
    PatchList::Patch(inst_, b.end, a.begin);
    return Frag(b.begin, a.end);
  }

  PatchList::Patch(inst_, a.end, b.begin);
  return Frag(a.begin, b.end);
}